

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App_inl.hpp
# Opt level: O0

void __thiscall
CLI::App::parse(App *this,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  App *this_local;
  
  if (this->parsed_ != 0) {
    clear(this);
  }
  this->parsed_ = 1;
  _validate(this);
  _configure(this);
  this->parent_ = (App *)0x0;
  this->parsed_ = 0;
  _parse(this,args);
  run_callback(this,false,false);
  return;
}

Assistant:

CLI11_INLINE void App::parse(std::vector<std::string> &&args) {
    // Clear if parsed
    if(parsed_ > 0)
        clear();

    // parsed_ is incremented in commands/subcommands,
    // but placed here to make sure this is cleared when
    // running parse after an error is thrown, even by _validate or _configure.
    parsed_ = 1;
    _validate();
    _configure();
    // set the parent as nullptr as this object should be the top now
    parent_ = nullptr;
    parsed_ = 0;

    _parse(std::move(args));
    run_callback();
}